

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Glucose::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  ulong *puVar1;
  uint uVar2;
  vec<unsigned_int> *pvVar3;
  uint *puVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  undefined7 in_register_00000031;
  ulong uVar16;
  vec<unsigned_int> *pvVar17;
  uint *puVar18;
  ulong uVar19;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this_00;
  uint uVar20;
  uint uVar21;
  Var best;
  int local_78;
  uint local_74;
  uint local_70;
  int local_6c;
  uint *local_68;
  vec<unsigned_int> *local_60;
  Queue<unsigned_int> *local_58;
  undefined4 local_4c;
  long local_48;
  uint *local_40;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000031,verbose);
  local_58 = &this->subsumption_queue;
  this_00 = &this->occurs;
  local_70 = 0;
  local_74 = 0;
  local_6c = 0;
  local_38 = this_00;
  do {
    iVar7 = (this->subsumption_queue).end;
    iVar13 = 0;
    iVar15 = (this->subsumption_queue).first;
    iVar9 = iVar7 - iVar15;
    if (iVar7 < iVar15) {
      iVar13 = (this->subsumption_queue).buf.sz;
    }
    iVar7 = iVar13 + iVar9;
    if ((iVar7 == 0 || SCARRY4(iVar13,iVar9) != iVar7 < 0) &&
       ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) {
      return true;
    }
    if ((this->super_Solver).asynch_interrupt == true) {
      if ((local_58->buf).data != (uint *)0x0) {
        (this->subsumption_queue).buf.sz = 0;
      }
      vec<unsigned_int>::growTo(&local_58->buf,1);
      (this->subsumption_queue).first = 0;
      (this->subsumption_queue).end = 0;
      this->bwdsub_assigns = (this->super_Solver).trail.sz;
      return true;
    }
    if (iVar7 == 0) {
      iVar7 = this->bwdsub_assigns;
      if (iVar7 < (this->super_Solver).trail.sz) {
        this->bwdsub_assigns = iVar7 + 1;
        puVar18 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        puVar18[(ulong)this->bwdsub_tmpunit + 3] = (this->super_Solver).trail.data[iVar7].x;
        puVar1 = (ulong *)(puVar18 + this->bwdsub_tmpunit);
        uVar10 = *puVar1 >> 0x20;
        if ((int)(*puVar1 >> 0x20) < 1) {
          uVar12 = 0;
        }
        else {
          uVar16 = 0;
          uVar12 = 0;
          do {
            uVar12 = uVar12 | 1 << (*(byte *)((long)puVar1 + uVar16 * 4 + 0xc) >> 1 & 0x1f);
            uVar16 = uVar16 + 1;
          } while (uVar10 != uVar16);
        }
        *(uint *)((long)puVar1 + uVar10 * 4 + 0xc) = uVar12;
        Queue<unsigned_int>::insert(local_58,this->bwdsub_tmpunit);
      }
    }
    iVar7 = (this->subsumption_queue).first;
    uVar12 = (this->subsumption_queue).buf.data[iVar7];
    iVar7 = iVar7 + 1;
    iVar15 = (this->subsumption_queue).buf.sz;
    if (iVar7 == iVar15) {
      iVar7 = 0;
    }
    (this->subsumption_queue).first = iVar7;
    puVar18 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
    bVar11 = false;
    if ((puVar18[uVar12] & 3) == 0) {
      if ((((char)local_4c != '\0') && (1 < (this->super_Solver).verbosity)) &&
         (iVar13 = local_6c * 0x26e978d5, iVar9 = local_6c + 1, uVar5 = local_6c * -0x60000000,
         local_6c = iVar9, (iVar13 + 0x10624d8U >> 3 | uVar5) < 0x418937)) {
        iVar13 = (this->subsumption_queue).end;
        if (iVar7 <= iVar13) {
          iVar15 = 0;
        }
        printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",
               (ulong)(uint)((iVar13 - iVar7) + iVar15),(ulong)local_74,(ulong)local_70);
      }
      puVar1 = (ulong *)(puVar18 + uVar12);
      iVar7 = *(int *)((long)puVar1 + 0xc) >> 1;
      local_78 = iVar7;
      if (1 < *(int *)((long)puVar1 + 4)) {
        pvVar3 = (this->occurs).occs.data;
        lVar8 = 4;
        do {
          iVar15 = *(int *)((long)puVar1 + lVar8 * 4) >> 1;
          if (pvVar3[iVar15].sz < pvVar3[iVar7].sz) {
            iVar7 = iVar15;
            local_78 = iVar15;
          }
          lVar14 = lVar8 + -2;
          lVar8 = lVar8 + 1;
        } while (lVar14 < *(int *)((long)puVar1 + 4));
      }
      if ((this->occurs).dirty.data[local_78] != '\0') {
        OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
                  (this_00,&local_78);
      }
      lVar8 = (long)local_78;
      pvVar3 = (this_00->occs).data;
      if (0 < pvVar3[lVar8].sz) {
        local_48 = (long)puVar1 + 0xc;
        pvVar17 = pvVar3 + lVar8;
        puVar18 = pvVar3[lVar8].data;
        iVar7 = 0;
        local_68 = puVar18;
        local_60 = pvVar17;
        do {
          if ((*puVar1 & 3) != 0) break;
          uVar5 = puVar18[iVar7];
          if (uVar5 != uVar12) {
            puVar4 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
            uVar10 = *(ulong *)(puVar4 + uVar5);
            if ((uVar10 & 3) == 0) {
              uVar16 = uVar10 >> 0x20;
              if ((this->subsumption_lim == -1) || ((int)(uVar10 >> 0x20) < this->subsumption_lim))
              {
                uVar10 = *puVar1 >> 0x20;
                if ((uVar16 < uVar10) ||
                   ((*(uint *)(local_48 + uVar10 * 4) & ~puVar4[(ulong)uVar5 + uVar16 + 3]) != 0)) {
LAB_00118e48:
                  uVar20 = 0xffffffff;
                }
                else {
                  uVar20 = 0xfffffffe;
                  if (uVar10 != 0) {
                    local_40 = puVar4 + (ulong)uVar5 + 3;
                    uVar19 = 0;
                    uVar21 = uVar20;
                    do {
                      uVar20 = uVar21;
                      bVar11 = uVar16 != 0;
                      if (uVar16 != 0) {
                        uVar2 = *(uint *)(local_48 + uVar19 * 4);
                        bVar11 = true;
                        if ((uVar2 != *local_40) &&
                           ((uVar21 != 0xfffffffe || (uVar20 = uVar2, (*local_40 ^ uVar2) != 1)))) {
                          lVar8 = 0;
                          do {
                            lVar14 = lVar8;
                            uVar20 = uVar21;
                            if ((uVar16 - 1 == lVar14) ||
                               (uVar2 == puVar4[(ulong)uVar5 + lVar14 + 4])) break;
                            lVar8 = lVar14 + 1;
                          } while ((uVar21 != 0xfffffffe) ||
                                  (uVar20 = uVar2, (puVar4[(ulong)uVar5 + lVar14 + 4] ^ uVar2) != 1)
                                  );
                          bVar11 = lVar14 + 1U < uVar16;
                        }
                      }
                      if (!bVar11) goto LAB_00118e48;
                      uVar19 = uVar19 + 1;
                      uVar21 = uVar20;
                    } while (uVar19 != uVar10);
                  }
                }
                bVar11 = true;
                if (uVar20 != 0xffffffff) {
                  if (uVar20 == 0xfffffffe) {
                    local_74 = local_74 + 1;
                    removeClause(this,uVar5,false);
                  }
                  else {
                    local_70 = local_70 + 1;
                    bVar6 = strengthenClause(this,uVar5,(Lit)(uVar20 ^ 1));
                    if (bVar6) {
                      iVar7 = iVar7 - (uint)((int)uVar20 >> 1 == local_78);
                    }
                    else {
                      bVar11 = false;
                    }
                  }
                }
                pvVar17 = local_60;
                puVar18 = local_68;
                this_00 = local_38;
                if (!bVar11) {
                  bVar11 = true;
                  goto LAB_00118f7a;
                }
              }
            }
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < pvVar17->sz);
      }
      bVar11 = false;
    }
LAB_00118f7a:
    if (bVar11) {
      return false;
    }
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}